

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O0

void CB_ADF::learn_MTR<true>(cb_adf *mydata,multi_learner *base,multi_ex *examples)

{
  float fVar1;
  ulong uVar2;
  reference ppeVar3;
  cb_class *pcVar4;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  cb_to_cs_adf *in_RSI;
  long in_RDI;
  uint64_t in_stack_00000008;
  v_array<COST_SENSITIVE::label> *in_stack_00000010;
  label *in_stack_00000018;
  v_array<CB::label> *in_stack_00000020;
  multi_ex *in_stack_00000028;
  multi_learner *in_stack_00000030;
  size_t in_stack_00000040;
  float old_weight;
  uint32_t nf;
  float local_44;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  float fVar5;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar6;
  
  GEN_CS::gen_cs_example_ips
            ((multi_ex *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (label *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  GEN_CS::call_cs_ldf<false>
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
             in_stack_00000010,in_stack_00000008,in_stack_00000040);
  ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,0);
  std::swap<v_array<ACTION_SCORE::action_score>>
            ((v_array<ACTION_SCORE::action_score> *)&((*ppeVar3)->pred).scalars,
             (v_array<ACTION_SCORE::action_score> *)(in_RDI + 0xd8));
  GEN_CS::gen_cs_example_mtr
            (in_RSI,in_RDX,(label *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      (in_RDX,(ulong)*(uint *)(in_RDI + 0x20));
  uVar6 = (uint)(*ppeVar3)->num_features;
  ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      (in_RDX,(ulong)*(uint *)(in_RDI + 0x20));
  fVar5 = (*ppeVar3)->weight;
  ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      (in_RDX,(ulong)*(uint *)(in_RDI + 0x20));
  pcVar4 = v_array<CB::cb_class>::operator[]((v_array<CB::cb_class> *)&((*ppeVar3)->l).simple,0);
  fVar1 = pcVar4->probability;
  uVar2 = *(ulong *)(in_RDI + 0x18);
  local_44 = (float)*(ulong *)(in_RDI + 0x10);
  ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      (in_RDX,(ulong)*(uint *)(in_RDI + 0x20));
  (*ppeVar3)->weight = (1.0 / fVar1) * ((float)uVar2 / local_44) * (*ppeVar3)->weight;
  GEN_CS::call_cs_ldf<true>
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
             in_stack_00000010,in_stack_00000008,in_stack_00000040);
  ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      (in_RDX,(ulong)*(uint *)(in_RDI + 0x20));
  (*ppeVar3)->num_features = (ulong)uVar6;
  ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      (in_RDX,(ulong)*(uint *)(in_RDI + 0x20));
  (*ppeVar3)->weight = fVar5;
  ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,0);
  std::swap<v_array<ACTION_SCORE::action_score>>
            ((v_array<ACTION_SCORE::action_score> *)&((*ppeVar3)->pred).scalars,
             (v_array<ACTION_SCORE::action_score> *)(in_RDI + 0xd8));
  return;
}

Assistant:

void learn_MTR(cb_adf& mydata, multi_learner& base, multi_ex& examples)
{
  // uint32_t action = 0;
  if (predict)  // first get the prediction to return
  {
    gen_cs_example_ips(examples, mydata.cs_labels);
    call_cs_ldf<false>(base, examples, mydata.cb_labels, mydata.cs_labels, mydata.prepped_cs_labels, mydata.offset);
    swap(examples[0]->pred.a_s, mydata.a_s);
  }
  // second train on _one_ action (which requires up to 3 examples).
  // We must go through the cost sensitive classifier layer to get
  // proper feature handling.
  gen_cs_example_mtr(mydata.gen_cs, examples, mydata.cs_labels);
  uint32_t nf = (uint32_t)examples[mydata.gen_cs.mtr_example]->num_features;
  float old_weight = examples[mydata.gen_cs.mtr_example]->weight;
  examples[mydata.gen_cs.mtr_example]->weight *= 1.f / examples[mydata.gen_cs.mtr_example]->l.cb.costs[0].probability *
      ((float)mydata.gen_cs.event_sum / (float)mydata.gen_cs.action_sum);

  //TODO!!! mydata.cb_labels are not getting properly restored (empty costs are dropped)
  GEN_CS::call_cs_ldf<true>(
      base, mydata.gen_cs.mtr_ec_seq, mydata.cb_labels, mydata.cs_labels, mydata.prepped_cs_labels, mydata.offset);
  examples[mydata.gen_cs.mtr_example]->num_features = nf;
  examples[mydata.gen_cs.mtr_example]->weight = old_weight;
  swap(examples[0]->pred.a_s, mydata.a_s);
}